

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall Gecko::Graph::relax(Graph *this,bool compatible,uint m)

{
  uint i;
  Progress *pPVar1;
  char *pcVar2;
  int iVar3;
  pointer puVar4;
  undefined7 in_register_00000031;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  Float FVar8;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pPVar1 = this->progress;
  if ((int)CONCAT71(in_register_00000031,compatible) == 0) {
    pcVar5 = "frelax";
    pcVar2 = "frelax";
  }
  else {
    pcVar5 = "crelax";
    pcVar2 = "crelax";
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,pcVar5,pcVar2 + 6);
  (*pPVar1->_vptr_Progress[6])(pPVar1,this,local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (m != 0) {
    do {
      if ((this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar6 = 1;
        uVar7 = 0;
        do {
          iVar3 = (*this->progress->_vptr_Progress[8])();
          if ((char)iVar3 != '\0') break;
          puVar4 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          i = puVar4[uVar7];
          if ((!compatible) ||
             ((this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
              super__Vector_impl_data._M_start[i].parent == 0)) {
            FVar8 = optimal(this,i);
            (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
            super__Vector_impl_data._M_start[i].pos = FVar8;
            puVar4 = (this->perm).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          uVar7 = (ulong)uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar7 < (ulong)((long)(this->perm).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >>
                                2));
      }
      m = m - 1;
    } while (m != 0);
  }
  place(this,true,0,
        (uint)((ulong)((long)(this->perm).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->perm).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2));
  (*this->progress->_vptr_Progress[7])(this->progress,this,1);
  return;
}

Assistant:

void
Graph::relax(bool compatible, uint m)
{
  progress->beginphase(this, compatible ? string("crelax") : string("frelax"));
  while (m--)
    for (uint k = 0; k < perm.size() && !progress->quit(); k++) {
      Node::Index i = perm[k];
      if (!compatible || !persistent(i))
        node[i].pos = optimal(i);
    }
  place(true);
  progress->endphase(this, true);
}